

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O0

string * __thiscall
slang::DiagnosticClient::getFileName_abi_cxx11_(DiagnosticClient *this,SourceLocation location)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  string_view sVar1;
  SourceManager *in_stack_00000018;
  SourceLocation in_stack_00000020;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  SourceManager *this_01;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  if ((*(byte *)(in_RSI + 0x18) & 1) == 0) {
    sVar1 = SourceManager::getFileName(in_stack_00000018,in_stack_00000020);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar1._M_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_00,in_RDX,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  else {
    SourceLocation::buffer((SourceLocation *)in_RDI);
    this_01 = in_stack_ffffffffffffffd0._0_8_;
    SourceManager::getFullPath_abi_cxx11_(this_01,(BufferID)in_stack_ffffffffffffffd0._12_4_);
    getU8Str((path *)0xa919c2);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

std::string DiagnosticClient::getFileName(SourceLocation location) const {
    if (absPaths)
        return getU8Str(sourceManager->getFullPath(location.buffer()));
    else
        return std::string(sourceManager->getFileName(location));
}